

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * google::protobuf::compiler::php::anon_unknown_2::BinaryToPhpString
                   (string *__return_storage_ptr__,string *src)

{
  undefined8 uVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  uchar *puVar5;
  byte *pbVar6;
  uchar auStack_38 [8];
  uchar symbol [16];
  size_t i;
  string *src_local;
  string *dest;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  builtin_memcpy(auStack_38,"01234567",8);
  builtin_memcpy(symbol,"89ABCDEF",8);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  symbol[8] = '\0';
  symbol[9] = '\0';
  symbol[10] = '\0';
  symbol[0xb] = '\0';
  symbol[0xc] = '\0';
  symbol[0xd] = '\0';
  symbol[0xe] = '\0';
  symbol[0xf] = '\0';
  for (; uVar1 = symbol._8_8_, uVar3 = std::__cxx11::string::size(), (ulong)uVar1 < uVar3;
      symbol._8_8_ = symbol._8_8_ + 1) {
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)src);
    if (((*pcVar4 == '\\') ||
        (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)src), *pcVar4 == '$')) ||
       (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)src), *pcVar4 == '\"')) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\\');
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)src);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar4);
    }
    else {
      puVar5 = (uchar *)std::__cxx11::string::operator[]((ulong)src);
      bVar2 = absl::lts_20240722::ascii_isprint(*puVar5);
      if (bVar2) {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)src);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar4);
      }
      else {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\\');
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'x');
        pbVar6 = (byte *)std::__cxx11::string::operator[]((ulong)src);
        std::__cxx11::string::operator+=
                  ((string *)__return_storage_ptr__,symbol[(ulong)(*pbVar6 >> 4) - 8]);
        pbVar6 = (byte *)std::__cxx11::string::operator[]((ulong)src);
        std::__cxx11::string::operator+=
                  ((string *)__return_storage_ptr__,symbol[(ulong)(*pbVar6 & 0xf) - 8]);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BinaryToPhpString(const std::string& src) {
  std::string dest;
  size_t i;
  unsigned char symbol[16] = {
      '0', '1', '2', '3', '4', '5', '6', '7',
      '8', '9', 'A', 'B', 'C', 'D', 'E', 'F',
  };

  dest.reserve(src.size() * 1.2);

  for (i = 0; i < src.size(); i++) {
    // To escape:
    // - escape sequences
    // - variable expansion: "hello $username";
    // - string termination
    if (src[i] == '\\' || src[i] == '$' || src[i] == '"') {
      dest += '\\';
      dest += src[i];
    } else if (absl::ascii_isprint(src[i])) {
      dest += src[i];
    } else {
      dest += '\\';
      dest += 'x';
      dest += symbol[(src[i] & 0xf0) >> 4];
      dest += symbol[src[i] & 0x0f];
    }
  }

  return dest;
}